

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

void __thiscall Shell::FunctionDefinition::~FunctionDefinition(FunctionDefinition *this)

{
  Entry *pEVar1;
  Def *this_00;
  bool bVar2;
  IteratorBase local_38;
  
  local_38._next = (this->_defs)._entries;
  local_38._last = (this->_defs)._afterLast;
  local_38._timestamp = (this->_defs)._timestamp;
  while( true ) {
    bVar2 = Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::
            IteratorBase::hasNext(&local_38);
    if (!bVar2) break;
    pEVar1 = local_38._next + 1;
    this_00 = (local_38._next)->_val;
    local_38._next = pEVar1;
    if (this_00 != (Def *)0x0) {
      Def::~Def(this_00);
    }
    ::operator_delete(this_00,0x40);
  }
  Lib::Array<int>::~Array((Array<int> *)&this->_counter);
  Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack(&this->_safeDefs);
  Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack(&this->_blockedDefs);
  Lib::DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
            (&this->_defs);
  return;
}

Assistant:

FunctionDefinition::~FunctionDefinition ()
{
  Fn2DefMap::Iterator dit(_defs);
  while(dit.hasNext()) {
    delete dit.next();
  }
}